

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O3

bool __thiscall
QPDFNumberTreeObjectHelper::hasIndex(QPDFNumberTreeObjectHelper *this,numtree_number idx)

{
  bool bVar1;
  iterator i;
  iterator iStack_68;
  iterator local_38;
  
  find(&local_38,this,idx,false);
  end(&iStack_68,this);
  bVar1 = NNTreeIterator::operator==
                    (local_38.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,iStack_68.impl.
                            super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iterator::~iterator(&iStack_68);
  iterator::~iterator(&local_38);
  return !bVar1;
}

Assistant:

bool
QPDFNumberTreeObjectHelper::hasIndex(numtree_number idx)
{
    auto i = find(idx);
    return (i != this->end());
}